

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

string * inja::Parser::load_file(string *__return_storage_ptr__,path *filename)

{
  byte bVar1;
  FileError *this;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_2b9;
  undefined1 local_2b8 [12];
  undefined1 local_2a8 [12];
  undefined1 local_292;
  undefined1 local_291;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_ifstream<char,_std::char_traits<char>_> local_220 [8];
  ifstream file;
  path *filename_local;
  string *text;
  
  ::std::ifstream::ifstream(local_220);
  std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            (local_220,filename,_S_in);
  bVar1 = ::std::ios::fail();
  if ((bVar1 & 1) != 0) {
    local_291 = 1;
    this = (FileError *)__cxa_allocate_exception(0x60);
    std::filesystem::__cxx11::path::string(&local_290,filename);
    ::std::operator+(&local_270,"failed accessing file at \'",&local_290);
    ::std::operator+(&local_250,&local_270,"\'");
    FileError::FileError(this,&local_250);
    local_291 = 0;
    __cxa_throw(this,&FileError::typeinfo,FileError::~FileError);
  }
  local_292 = 0;
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_2a8,
             (istream_type *)local_220);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_2b8);
  ::std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_2a8._0_8_;
  __beg._M_c = local_2a8._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_2b8._0_8_;
  __end._M_c = local_2b8._8_4_;
  ::std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__beg,__end,&local_2b9);
  ::std::allocator<char>::~allocator(&local_2b9);
  local_292 = 1;
  ::std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

static std::string load_file(const std::filesystem::path& filename) {
    std::ifstream file;
    file.open(filename);
    if (file.fail()) {
      INJA_THROW(FileError("failed accessing file at '" + filename.string() + "'"));
    }
    std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());
    return text;
  }